

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

limb_type_conflict
math::wide_integer::uintwide_t<96u,unsigned_short,void,false>::
eval_multiply_1d<unsigned_short*,unsigned_short_const*>
          (unsigned_short *r,unsigned_short *a,value_type_conflict3 b,unsigned_fast_type count)

{
  unsigned_short uVar1;
  unsigned_short *last;
  ulong local_40;
  unsigned_fast_type i;
  unsigned_fast_type imax;
  unsigned_fast_type uStack_28;
  local_double_limb_type carry;
  unsigned_fast_type count_local;
  ushort *puStack_18;
  value_type_conflict3 b_local;
  unsigned_short *a_local;
  unsigned_short *r_local;
  
  imax._4_4_ = 0;
  uStack_28 = count;
  count_local._6_2_ = b;
  puStack_18 = a;
  a_local = r;
  if (b == 0) {
    last = detail::advance_and_point<unsigned_short*,unsigned_long>(r,count);
    detail::fill_unsafe<unsigned_short*,unsigned_short>(r,last,0);
  }
  else {
    for (local_40 = 0; local_40 < count; local_40 = local_40 + 1) {
      imax._4_4_ = imax._4_4_ + (uint)*puStack_18 * (uint)count_local._6_2_;
      *a_local = (unsigned_short)imax._4_4_;
      puStack_18 = puStack_18 + 1;
      a_local = a_local + 1;
      uVar1 = detail::make_hi<unsigned_short,unsigned_int>((uint *)((long)&imax + 4));
      imax._4_4_ = (uint)uVar1;
    }
  }
  return (limb_type_conflict)imax._4_4_;
}

Assistant:

static constexpr auto eval_multiply_1d(      ResultIterator                                               r,
                                                 InputIteratorLeft                                            a,
                                           const typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type b,
                                           const unsigned_fast_type                                           count) -> limb_type
    {
      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;
      using left_value_type = typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type;

      static_assert
      (
        (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<left_value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      auto carry = static_cast<local_double_limb_type>(UINT8_C(0));

      if(b == static_cast<left_value_type>(UINT8_C(0)))
      {
        detail::fill_unsafe(r, detail::advance_and_point(r, count), static_cast<limb_type>(UINT8_C(0)));
      }
      else
      {
        #if defined(WIDE_INTEGER_HAS_CLZ_LIMB_OPTIMIZATIONS)
        auto clz_a = static_cast<unsigned_fast_type>(UINT8_C(0));

        if(count > static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          using input_left_value_type  = typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type;

          auto it_leading_zeros_a = detail::advance_and_point(a, static_cast<unsigned_fast_type>(count - static_cast<unsigned_fast_type>(UINT8_C(1)))); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

          while(   (it_leading_zeros_a != a) // NOLINT(altera-id-dependent-backward-branch)
                && (*it_leading_zeros_a == static_cast<input_left_value_type>(UINT8_C(0))))
          {
            --it_leading_zeros_a;

            ++clz_a;
          }
        }

        const auto imax = static_cast<unsigned_fast_type>(count - clz_a);

        #else

        const auto imax = count;

        #endif

        auto i = static_cast<unsigned_fast_type>(UINT8_C(0));

        for( ; i < imax; ++i) // NOLINT(altera-id-dependent-backward-branch)
        {
          carry =
            static_cast<local_double_limb_type>
            (
                carry
              + static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*a++) * b)
            );

          *r++  = static_cast<local_limb_type>(carry);
          carry = static_cast<local_double_limb_type>(detail::make_hi<local_limb_type>(carry));
        }

        #if defined(WIDE_INTEGER_HAS_CLZ_LIMB_OPTIMIZATIONS)
        for( ; i < count; ++i)
        {
          *r++  = static_cast<local_limb_type>(carry);
          carry = static_cast<local_double_limb_type>(UINT8_C(0));
        }
        #endif
      }

      return static_cast<local_limb_type>(carry);
    }